

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3.c
# Opt level: O2

void mp3_calc_hdr(mp3_frame_t *frame)

{
  byte bVar1;
  ushort uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  unsigned_long uVar8;
  long lVar9;
  unsigned_long *puVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  
  if (frame == (mp3_frame_t *)0x0) {
    __assert_fail("frame != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3.c",0x31,
                  "void mp3_calc_hdr(mp3_frame_t *)");
  }
  bVar1 = frame->id;
  bVar11 = frame->mode == '\x03';
  lVar7 = -0x20;
  if (bVar11) {
    lVar7 = -0x11;
  }
  uVar8 = 0x20;
  if (bVar11) {
    uVar8 = 0x11;
  }
  puVar10 = lsf_bitratetable;
  if (bVar1 == 3) {
    puVar10 = bitratetable;
  }
  uVar3 = puVar10[frame->bitrate_index];
  frame->bitrate = uVar3;
  uVar2 = sampleratetable[bVar1][frame->samplerfindex];
  frame->samplerate = (ulong)uVar2;
  lVar5 = 72000;
  lVar9 = (ulong)bVar11 * 8 + -0x11;
  uVar4 = (ulong)!bVar11 * 8 + 9;
  if (bVar1 == 3) {
    lVar5 = 0x23280;
    lVar9 = lVar7;
    uVar4 = uVar8;
  }
  frame->samplelen = 0x480;
  frame->si_size = uVar4;
  frame->si_bitsize = (ulong)(uint)((int)uVar4 * 8);
  uVar8 = (ulong)frame->padding_bit + (lVar5 * uVar3) / (ulong)uVar2;
  frame->frame_size = uVar8;
  frame->frame_data_size = (lVar9 + uVar8) - 4;
  if (frame->protected == '\0') {
    frame->frame_data_size = (lVar9 + uVar8) - 6;
  }
  auVar12._8_4_ = (int)(uVar8 >> 0x20);
  auVar12._0_8_ = uVar8;
  auVar12._12_4_ = 0x45300000;
  auVar13._8_4_ = (int)(uVar3 >> 0x20);
  auVar13._0_8_ = uVar3;
  auVar13._12_4_ = 0x45300000;
  dVar14 = (((auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) * 8.0 * 1000.0) /
           ((auVar13._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
  uVar6 = (ulong)dVar14;
  frame->usec = (long)(dVar14 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
  return;
}

Assistant:

void mp3_calc_hdr(mp3_frame_t *frame) {
  assert(frame != NULL);

  const int is_lsf = frame->id != MPEG_VERSION_1; // MPEG 2 and 2.5 are Lower Sampling Frequency extension

  if (is_lsf) {
    frame->bitrate = lsf_bitratetable[frame->bitrate_index];
  } else {
    frame->bitrate = bitratetable[frame->bitrate_index];

  }
  frame->samplerate = sampleratetable[frame->id][frame->samplerfindex];
  frame->samplelen = 1152; /* only layer III */
  if (is_lsf) {
    frame->si_size = frame->mode != (unsigned char) 3 ? 17 : 9;
  } else {
    frame->si_size = frame->mode != (unsigned char) 3 ? 32 : 17;
  }
  frame->si_bitsize = frame->si_size * 8;

  /* calculate frame length */
  if (is_lsf) {
    frame->frame_size = 72000 * frame->bitrate;
  } else {
    frame->frame_size = 144000 * frame->bitrate;
  }
  frame->frame_size /= frame->samplerate;
  frame->frame_size += frame->padding_bit;

  frame->frame_data_size = frame->frame_size - 4 - frame->si_size;
  if (frame->protected == 0)
    frame->frame_data_size -= 2;

  frame->usec = (double) frame->frame_size * 8 * 1000.0 / ((double) frame->bitrate);
}